

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.cc
# Opt level: O0

void __thiscall
xLearn::LinearScore::calc_grad_ftrl
          (LinearScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  real_t rVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  pointer pNVar4;
  real_t *prVar5;
  int iVar6;
  real_t *prVar7;
  float *pfVar8;
  Model *in_RDX;
  long in_RDI;
  float in_XMM0_Da;
  uint uVar9;
  double dVar10;
  double dVar11;
  uint in_XMM1_Da;
  int sign;
  real_t sigma;
  real_t old_wbg;
  real_t g;
  real_t *wbz;
  real_t *wbg;
  real_t *wb;
  int sign_1;
  real_t sigma_1;
  real_t old_wlg;
  real_t g_1;
  real_t *wlz;
  real_t *wlg;
  real_t *wl;
  index_t feat_id;
  const_iterator iter;
  index_t num_feat;
  real_t *w;
  real_t sqrt_norm;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  float fVar12;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_40;
  index_t local_34;
  real_t *local_30;
  float local_24;
  float local_1c;
  Model *local_18;
  
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  dVar10 = std::sqrt((double)(ulong)in_XMM1_Da);
  local_24 = SUB84(dVar10,0);
  local_30 = Model::GetParameter_w(local_18);
  local_34 = Model::GetNumFeature(local_18);
  local_40._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_ffffffffffffff28);
  while( true ) {
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end(in_stack_ffffffffffffff28);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar3) break;
    pNVar4 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_40);
    fVar12 = local_1c;
    uVar9 = pNVar4->feat_id;
    if (uVar9 < local_34) {
      prVar5 = local_30 + uVar9 * 3;
      prVar7 = local_30 + (uVar9 * 3 + 1);
      pfVar8 = local_30 + (uVar9 * 3 + 2);
      uVar9 = *(uint *)(in_RDI + 0x1c);
      rVar1 = *prVar5;
      pNVar4 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_40);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)rVar1),ZEXT416(uVar9),
                               ZEXT416((uint)(fVar12 * pNVar4->feat_val * local_24)));
      uVar9 = auVar2._0_4_;
      rVar1 = *prVar7;
      auVar2 = vfmadd213ss_fma(ZEXT416(uVar9),ZEXT416(uVar9),ZEXT416((uint)*prVar7));
      *prVar7 = auVar2._0_4_;
      dVar10 = std::sqrt((double)(ulong)(uint)*prVar7);
      dVar11 = std::sqrt((double)(ulong)(uint)rVar1);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)*prVar5),
                               ZEXT416((uint)-((SUB84(dVar10,0) - SUB84(dVar11,0)) /
                                              *(float *)(in_RDI + 0x10))),ZEXT416(uVar9));
      *pfVar8 = auVar2._0_4_ + *pfVar8;
      iVar6 = -1;
      if (0.0 < *pfVar8) {
        iVar6 = 1;
      }
      if (*(float *)(in_RDI + 0x18) < (float)iVar6 * *pfVar8) {
        auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),ZEXT416((uint)(float)iVar6),
                                 ZEXT416((uint)-*pfVar8));
        fVar12 = *(float *)(in_RDI + 0x14);
        dVar10 = std::sqrt((double)(ulong)(uint)*prVar7);
        *prVar5 = auVar2._0_4_ /
                  ((fVar12 + SUB84(dVar10,0)) / *(float *)(in_RDI + 0x10) +
                  *(float *)(in_RDI + 0x1c));
      }
      else {
        *prVar5 = 0.0;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_40);
  }
  prVar5 = Model::GetParameter_b(local_18);
  prVar7 = prVar5 + 1;
  pfVar8 = prVar5 + 2;
  rVar1 = *prVar7;
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_1c),ZEXT416((uint)local_1c),ZEXT416((uint)*prVar7));
  *prVar7 = auVar2._0_4_;
  local_30 = prVar5;
  dVar10 = std::sqrt((double)(ulong)(uint)*prVar7);
  dVar11 = std::sqrt((double)(ulong)(uint)rVar1);
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)*prVar5),
                           ZEXT416((uint)-((SUB84(dVar10,0) - SUB84(dVar11,0)) /
                                          *(float *)(in_RDI + 0x10))),ZEXT416((uint)local_1c));
  *pfVar8 = auVar2._0_4_ + *pfVar8;
  iVar6 = -1;
  if (0.0 < *pfVar8) {
    iVar6 = 1;
  }
  if (*(float *)(in_RDI + 0x18) < (float)iVar6 * *pfVar8) {
    auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),ZEXT416((uint)(float)iVar6),
                             ZEXT416((uint)-*pfVar8));
    fVar12 = *(float *)(in_RDI + 0x14);
    dVar10 = std::sqrt((double)(ulong)(uint)*prVar7);
    *prVar5 = auVar2._0_4_ /
              ((fVar12 + SUB84(dVar10,0)) / *(float *)(in_RDI + 0x10) + *(float *)(in_RDI + 0x1c));
  }
  else {
    *prVar5 = 0.0;
  }
  return;
}

Assistant:

void LinearScore::calc_grad_ftrl(const SparseRow* row,
                                 Model& model,
                                 real_t pg,
                                 real_t norm) {
  // linear term
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }
}